

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall detail::reader::operator()(reader *this,ptime *val)

{
  ptime pVar1;
  string iso_str;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  operator()(this,&local_28);
  pVar1 = boost::posix_time::from_iso_string(&local_28);
  (val->
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  ).time_.time_count_.value_ = (int_type)pVar1;
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void operator()(boost::posix_time::ptime& val) const {
        std::string iso_str;
        (*this)(iso_str);
        val = boost::posix_time::from_iso_string(iso_str);
    }